

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall AsymmetricAlgorithm::verifyFinal(AsymmetricAlgorithm *this,ByteString *param_1)

{
  bool bVar1;
  ByteString *param_1_local;
  AsymmetricAlgorithm *this_local;
  
  bVar1 = this->currentOperation == VERIFY;
  if (bVar1) {
    this->currentOperation = NONE;
    this->currentPublicKey = (PublicKey *)0x0;
    this->currentMechanism = Unknown;
  }
  return bVar1;
}

Assistant:

bool AsymmetricAlgorithm::verifyFinal(const ByteString& /*signature*/)
{
	if (currentOperation != VERIFY)
	{
		return false;
	}

	currentOperation = NONE;
	currentPublicKey = NULL;
	currentMechanism = AsymMech::Unknown;

	return true;
}